

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void createstdfile(lua_State *L,FILE *f,int k,char *fname)

{
  FILE **ppFVar1;
  char *fname_local;
  int k_local;
  FILE *f_local;
  lua_State *L_local;
  
  ppFVar1 = newfile(L);
  *ppFVar1 = f;
  if (0 < k) {
    lua_pushvalue(L,-1);
    lua_rawseti(L,-0x2711,k);
  }
  lua_pushvalue(L,-2);
  lua_setfenv(L,-2);
  lua_setfield(L,-3,fname);
  return;
}

Assistant:

static void createstdfile(lua_State*L,FILE*f,int k,const char*fname){
*newfile(L)=f;
if(k>0){
lua_pushvalue(L,-1);
lua_rawseti(L,(-10001),k);
}
lua_pushvalue(L,-2);
lua_setfenv(L,-2);
lua_setfield(L,-3,fname);
}